

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.h
# Opt level: O2

void print_input_usage(void)

{
  pointer pbVar1;
  ostream *poVar2;
  pointer pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> f;
  string asStack_48 [32];
  
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "  --in-format       the format of the input file. Defaults to \"flagser\". Available options are:"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  pbVar1 = available_input_formats_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = available_input_formats_abi_cxx11_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    std::__cxx11::string::string(asStack_48,(string *)pbVar3);
    poVar2 = std::operator<<((ostream *)&std::cerr,"                         ");
    poVar2 = std::operator<<(poVar2,asStack_48);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string(asStack_48);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "  --h5-type type     the type of data in the h5-file. The type can either be \"matrix\""
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,
                           "                     if at the given path in the HDF5-file there is the connectivity matrix or"
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,
                           "                     \"grouped\" if the connectivity matrices are grouped. To only"
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,
                           "                     consider a subset of the groups you can list them after"
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,
                           "                     \"grouped\", e.g. \"grouped:L1_DAC,L2*\". The star is a placeholder"
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,
                           "                     for arbitrary characters. The type defaults to \"matrix\" and is"
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"                     only relevant for the input type h5.");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2," [HDF5 library not found]");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"  --undirected       compute the *undirected* flag complex");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,
                           "  --components       compute the directed flag complex for each individual connected"
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,
                           "                     component of the input graph. Warning: this currently only works"
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,
                           "                     for the trivial filtration. Additionally, isolated vertices are"
                          );
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"                     ignored.");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void print_input_usage() {
	std::cerr << "  --in-format       the format of the input file. Defaults to \"flagser\". Available options are:"
	          << std::endl;

	for (auto f : available_input_formats) std::cerr << "                         " << f << std::endl;

	std::cerr << "  --h5-type type     the type of data in the h5-file. The type can either be \"matrix\"" << std::endl
	          << "                     if at the given path in the HDF5-file there is the connectivity matrix or"
	          << std::endl
	          << "                     \"grouped\" if the connectivity matrices are grouped. To only" << std::endl
	          << "                     consider a subset of the groups you can list them after" << std::endl
	          << "                     \"grouped\", e.g. \"grouped:L1_DAC,L2*\". The star is a placeholder" << std::endl
	          << "                     for arbitrary characters. The type defaults to \"matrix\" and is" << std::endl
	          << "                     only relevant for the input type h5." << std::endl
#ifndef WITH_HDF5
	          << " [HDF5 library not found]" << std::endl
#endif
	          << "  --undirected       compute the *undirected* flag complex" << std::endl
	          << "  --components       compute the directed flag complex for each individual connected" << std::endl
	          << "                     component of the input graph. Warning: this currently only works" << std::endl
	          << "                     for the trivial filtration. Additionally, isolated vertices are" << std::endl
	          << "                     ignored." << std::endl
	          << std::endl;
}